

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O0

void __thiscall
UnscentedKalmanFilter::SigmaPointPrediction
          (UnscentedKalmanFilter *this,double delta_t,MatrixXd *Xsig_aug,MatrixXd *Xsig_pred)

{
  double dVar1;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dts;
  double yawd_p;
  double yaw_p;
  double v_p;
  double py_p;
  double px_p;
  double nuyawdd;
  double nua;
  double yawd;
  double yaw;
  double v;
  double py;
  double px;
  int i;
  MatrixXd *Xsig_pred_local;
  MatrixXd *Xsig_aug_local;
  double delta_t_local;
  UnscentedKalmanFilter *this_local;
  
  for (px._4_4_ = 0; px._4_4_ < this->n_sigma_; px._4_4_ = px._4_4_ + 1) {
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,0,
                        (long)px._4_4_);
    dVar10 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,1,
                        (long)px._4_4_);
    dVar11 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,2,
                        (long)px._4_4_);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,3,
                        (long)px._4_4_);
    __x = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,4,
                        (long)px._4_4_);
    dVar2 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,5,
                        (long)px._4_4_);
    dVar3 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,6,
                        (long)px._4_4_);
    dVar4 = *pdVar5;
    if (ABS(dVar2) <= 0.001) {
      dVar7 = cos(__x);
      dVar7 = dVar1 * delta_t * dVar7;
      dVar8 = sin(__x);
      dVar8 = dVar1 * delta_t * dVar8;
    }
    else {
      dVar7 = sin(dVar2 * delta_t + __x);
      dVar8 = sin(__x);
      dVar7 = (dVar1 / dVar2) * (dVar7 - dVar8);
      dVar8 = cos(__x);
      dVar9 = cos(dVar2 * delta_t + __x);
      dVar8 = (dVar1 / dVar2) * (dVar8 - dVar9);
    }
    py_p = dVar7 + dVar10;
    v_p = dVar8 + dVar11;
    dVar10 = delta_t * delta_t;
    dVar11 = cos(__x);
    dVar7 = sin(__x);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)Xsig_pred,0,
                        (long)px._4_4_);
    *pSVar6 = dVar3 * 0.5 * dVar10 * dVar11 + py_p;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)Xsig_pred,1,
                        (long)px._4_4_);
    *pSVar6 = dVar3 * 0.5 * dVar10 * dVar7 + v_p;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)Xsig_pred,2,
                        (long)px._4_4_);
    *pSVar6 = dVar3 * delta_t + dVar1;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)Xsig_pred,3,
                        (long)px._4_4_);
    *pSVar6 = dVar4 * 0.5 * dVar10 + dVar2 * delta_t + __x;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)Xsig_pred,4,
                        (long)px._4_4_);
    *pSVar6 = dVar4 * delta_t + dVar2;
  }
  return;
}

Assistant:

void UnscentedKalmanFilter::SigmaPointPrediction(double delta_t, const MatrixXd &Xsig_aug, MatrixXd &Xsig_pred) const {

  for (int i=0; i<n_sigma_; i++) {

    // extract values for better readability
    double px      = Xsig_aug(0,i);
    double py      = Xsig_aug(1,i);
    double v       = Xsig_aug(2,i);
    double yaw     = Xsig_aug(3,i);
    double yawd    = Xsig_aug(4,i);
    double nua     = Xsig_aug(5,i);
    double nuyawdd = Xsig_aug(6,i);

    // predicted state values
    double px_p, py_p;

    if (fabs(yawd) > 0.001) {
      px_p = px + v/yawd * (sin(yaw+yawd*delta_t) - sin(yaw));
      py_p = py + v/yawd * (cos(yaw) - cos(yaw+yawd*delta_t));
    } else {
      px_p = px + v*delta_t*cos(yaw);
      py_p = py + v*delta_t*sin(yaw);
    }

    double v_p = v;
    double yaw_p = yaw + yawd*delta_t;
    double yawd_p = yawd;

    // add noise
    double dts = delta_t * delta_t;
    px_p = px_p + 0.5*nua*dts*cos(yaw);
    py_p = py_p + 0.5*nua*dts*sin(yaw);
    v_p = v_p + nua*delta_t;

    yaw_p = yaw_p + 0.5*nuyawdd*dts;
    yawd_p = yawd_p + nuyawdd*delta_t;

    // write predicted sigma point into right column
    Xsig_pred(0,i) = px_p;
    Xsig_pred(1,i) = py_p;
    Xsig_pred(2,i) = v_p; 
    Xsig_pred(3,i) = yaw_p;
    Xsig_pred(4,i) = yawd_p;
  }
}